

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::Initialize
          (ChLinkMotorLinearDriveline *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChFrame<double> *mframe1,
          ChFrame<double> *mframe2)

{
  ChShaftsBodyTranslation *pCVar1;
  ChShaftsBody *this_00;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_150;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b0,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c0,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  ChFrame<double>::ChFrame(&local_b8,mframe1);
  ChFrame<double>::ChFrame(&local_140,mframe2);
  ChLinkMateGeneric::Initialize
            ((ChLinkMateGeneric *)this,(shared_ptr<chrono::ChBodyFrame> *)&local_1b0,
             (shared_ptr<chrono::ChBodyFrame> *)&local_1c0,pos_are_relative,&local_b8,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
  pCVar1 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_150,
             (__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorLinear).field_0x278);
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_160,&mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  ChShaftsBodyTranslation::Initialize
            (pCVar1,(shared_ptr<chrono::ChShaft> *)&local_150,
             (shared_ptr<chrono::ChBodyFrame> *)&local_160,(ChVector<double> *)&VECT_X,
             (ChVector<double> *)&VNULL);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  pCVar1 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_170,
             &(this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  ChShaftsBodyTranslation::Initialize
            (pCVar1,(shared_ptr<chrono::ChShaft> *)&local_170,
             (shared_ptr<chrono::ChBodyFrame> *)&local_180,(ChVector<double> *)&VECT_X,
             (ChVector<double> *)&VNULL);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
  this_00 = (this->innerconstraint2rot).
            super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_190,
             &(this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a0,&mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  ChShaftsBody::Initialize
            (this_00,(shared_ptr<chrono::ChShaft> *)&local_190,
             (shared_ptr<chrono::ChBodyFrame> *)&local_1a0,(ChVector<double> *)&VECT_X);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                            std::shared_ptr<ChBodyFrame> mbody2,
                                            bool pos_are_relative,
                                            ChFrame<> mframe1,
                                            ChFrame<> mframe2) {
    ChLinkMotorLinear::Initialize(mbody1, mbody2, pos_are_relative, mframe1, mframe2);
    innerconstraint1lin->Initialize(innershaft1lin, mbody1, VECT_X, VNULL);
    innerconstraint2lin->Initialize(innershaft2lin, mbody2, VECT_X, VNULL);
    innerconstraint2rot->Initialize(innershaft2rot, mbody2, VECT_X);
}